

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

int __thiscall icu_63::Normalizer2Impl::init(Normalizer2Impl *this,EVP_PKEY_CTX *ctx)

{
  uint16_t *in_RCX;
  UCPTrie *in_RDX;
  uint8_t *in_R8;
  uint8_t *inSmallFCD_local;
  uint16_t *inExtraData_local;
  UCPTrie *inTrie_local;
  int32_t *inIndexes_local;
  Normalizer2Impl *this_local;
  
  this->minDecompNoCP = (UChar)*(undefined4 *)(ctx + 0x20);
  this->minCompNoMaybeCP = (UChar)*(undefined4 *)(ctx + 0x24);
  this->minLcccCP = (UChar)*(undefined4 *)(ctx + 0x48);
  this->minYesNo = (uint16_t)*(undefined4 *)(ctx + 0x28);
  this->minYesNoMappingsOnly = (uint16_t)*(undefined4 *)(ctx + 0x38);
  this->minNoNo = (uint16_t)*(undefined4 *)(ctx + 0x2c);
  this->minNoNoCompBoundaryBefore = (uint16_t)*(undefined4 *)(ctx + 0x3c);
  this->minNoNoCompNoMaybeCC = (uint16_t)*(undefined4 *)(ctx + 0x40);
  this->minNoNoEmpty = (uint16_t)*(undefined4 *)(ctx + 0x44);
  this->limitNoNo = (uint16_t)*(undefined4 *)(ctx + 0x30);
  this->minMaybeYes = (uint16_t)*(undefined4 *)(ctx + 0x34);
  this->centerNoNoDelta = (short)((int)(uint)this->minMaybeYes >> 3) - 0x41;
  this->normTrie = in_RDX;
  this->maybeYesCompositions = in_RCX;
  this->extraData = this->maybeYesCompositions + ((int)(0xfc00 - (uint)this->minMaybeYes) >> 1);
  this->smallFCD = in_R8;
  return (int)this;
}

Assistant:

void
Normalizer2Impl::init(const int32_t *inIndexes, const UCPTrie *inTrie,
                      const uint16_t *inExtraData, const uint8_t *inSmallFCD) {
    minDecompNoCP = static_cast<UChar>(inIndexes[IX_MIN_DECOMP_NO_CP]);
    minCompNoMaybeCP = static_cast<UChar>(inIndexes[IX_MIN_COMP_NO_MAYBE_CP]);
    minLcccCP = static_cast<UChar>(inIndexes[IX_MIN_LCCC_CP]);

    minYesNo = static_cast<uint16_t>(inIndexes[IX_MIN_YES_NO]);
    minYesNoMappingsOnly = static_cast<uint16_t>(inIndexes[IX_MIN_YES_NO_MAPPINGS_ONLY]);
    minNoNo = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO]);
    minNoNoCompBoundaryBefore = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]);
    minNoNoCompNoMaybeCC = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_COMP_NO_MAYBE_CC]);
    minNoNoEmpty = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_EMPTY]);
    limitNoNo = static_cast<uint16_t>(inIndexes[IX_LIMIT_NO_NO]);
    minMaybeYes = static_cast<uint16_t>(inIndexes[IX_MIN_MAYBE_YES]);
    U_ASSERT((minMaybeYes & 7) == 0);  // 8-aligned for noNoDelta bit fields
    centerNoNoDelta = (minMaybeYes >> DELTA_SHIFT) - MAX_DELTA - 1;

    normTrie=inTrie;

    maybeYesCompositions=inExtraData;
    extraData=maybeYesCompositions+((MIN_NORMAL_MAYBE_YES-minMaybeYes)>>OFFSET_SHIFT);

    smallFCD=inSmallFCD;
}